

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O0

void __thiscall booster::bad_callback_call::bad_callback_call(bad_callback_call *this)

{
  undefined8 *in_RDI;
  allocator *s;
  runtime_error *in_stack_ffffffffffffffc0;
  allocator local_29;
  string local_28 [40];
  
  s = &local_29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"bad_callback_call",s);
  runtime_error::runtime_error(in_stack_ffffffffffffffc0,(string *)s);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  *in_RDI = &PTR__bad_callback_call_00116ae0;
  in_RDI[2] = &PTR__bad_callback_call_00116b08;
  return;
}

Assistant:

bad_callback_call() : 
			booster::runtime_error("bad_callback_call")
		{
		}